

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pardiso_interface.c
# Opt level: O0

c_int init_linsys_solver_pardiso
                (pardiso_solver **sp,csc *P,csc *A,c_float sigma,c_float *rho_vec,c_int polish)

{
  csc *P_00;
  c_int *mnum;
  void *pvVar1;
  c_int *pcVar2;
  csc *pcVar3;
  c_float *pcVar4;
  c_int *in_RCX;
  long in_RDX;
  c_float *unaff_RBX;
  c_int *unaff_RBP;
  long in_RSI;
  undefined8 *in_RDI;
  c_int *in_R8;
  c_int *unaff_R12;
  c_int *unaff_R13;
  c_int *unaff_R14;
  c_int *unaff_R15;
  c_float *in_XMM0_Qa;
  c_int *unaff_retaddr;
  c_float *in_stack_00000008;
  c_float *in_stack_00000010;
  c_int *in_stack_00000018;
  pardiso_solver *s;
  c_int n_plus_m;
  c_int nnzKKT;
  c_int i;
  c_int *in_stack_ffffffffffffff48;
  c_int *in_stack_ffffffffffffff50;
  c_float *in_stack_ffffffffffffff58;
  pardiso_solver *in_stack_ffffffffffffff60;
  pardiso_solver *s_00;
  c_int in_stack_ffffffffffffff68;
  c_int *n;
  csc *in_stack_ffffffffffffff70;
  c_int **ppcVar5;
  long lVar6;
  void **pt;
  c_int local_38;
  
  P_00 = (csc *)calloc(1,0x4f8);
  *in_RDI = P_00;
  P_00[2].nzmax = *(c_int *)(in_RSI + 0x10);
  P_00[2].m = *(c_int *)(in_RDX + 8);
  mnum = (c_int *)(P_00[2].nzmax + P_00[2].m);
  P_00[0x14].i = mnum;
  P_00[1].x = in_XMM0_Qa;
  P_00[1].nz = (c_int)in_R8;
  P_00->m = (c_int)solve_linsys_pardiso;
  P_00->n = (c_int)free_linsys_solver_pardiso;
  P_00->p = (c_int *)update_linsys_solver_matrices_pardiso;
  P_00->i = (c_int *)update_linsys_solver_rho_vec_pardiso;
  *(undefined4 *)&P_00->nzmax = 1;
  pvVar1 = malloc((long)mnum * 8);
  P_00[1].n = (c_int)pvVar1;
  pcVar2 = (c_int *)malloc((long)mnum << 3);
  P_00[1].p = pcVar2;
  pcVar2 = (c_int *)malloc((long)mnum << 3);
  P_00[1].i = pcVar2;
  if (in_R8 == (c_int *)0x0) {
    pvVar1 = malloc(*(long *)(*(long *)(in_RSI + 0x18) + *(long *)(in_RSI + 0x10) * 8) << 3);
    P_00[0x16].n = (c_int)pvVar1;
    pcVar2 = (c_int *)malloc(*(long *)(*(long *)(in_RDX + 0x18) + *(long *)(in_RDX + 0x10) * 8) << 3
                            );
    P_00[0x16].p = pcVar2;
    pcVar2 = (c_int *)malloc(*(long *)(in_RDX + 8) << 3);
    P_00[0x16].i = pcVar2;
    for (ppcVar5 = (c_int **)0x0; (long)ppcVar5 < *(long *)(in_RDX + 8);
        ppcVar5 = (c_int **)((long)ppcVar5 + 1)) {
      P_00[1].i[(long)ppcVar5] = (c_int)(1.0 / (double)in_RCX[(long)ppcVar5]);
    }
    pcVar3 = form_KKT(P_00,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                      (c_float)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                      in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,ppcVar5,in_R8,in_RCX);
    P_00->nz = (c_int)pcVar3;
  }
  else {
    for (ppcVar5 = (c_int **)0x0; (long)ppcVar5 < *(long *)(in_RDX + 8);
        ppcVar5 = (c_int **)((long)ppcVar5 + 1)) {
      P_00[1].i[(long)ppcVar5] = (c_int)in_XMM0_Qa;
    }
    pcVar3 = form_KKT(P_00,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                      (c_float)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                      in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,ppcVar5,in_R8,in_RCX);
    P_00->nz = (c_int)pcVar3;
  }
  if (P_00->nz == 0) {
    printf("ERROR in %s: ","init_linsys_solver_pardiso");
    printf("Error in forming KKT matrix");
    printf("\n");
    free_linsys_solver_pardiso(in_stack_ffffffffffffff60);
    local_38 = 4;
  }
  else {
    pcVar2 = *(c_int **)(*(long *)(P_00->nz + 0x18) + *(long *)(P_00->nz + 8) * 8);
    pvVar1 = malloc((long)pcVar2 << 3);
    P_00[1].nzmax = (c_int)pvVar1;
    pvVar1 = malloc((*(long *)(P_00->nz + 8) + 1) * 8);
    P_00[1].m = (c_int)pvVar1;
    for (lVar6 = 0; lVar6 < (long)pcVar2; lVar6 = lVar6 + 1) {
      *(long *)(P_00[1].nzmax + lVar6 * 8) = *(long *)(*(long *)(P_00->nz + 0x20) + lVar6 * 8) + 1;
    }
    for (lVar6 = 0; lVar6 < (long)mnum + 1; lVar6 = lVar6 + 1) {
      *(long *)(P_00[1].m + lVar6 * 8) = *(long *)(*(long *)(P_00->nz + 0x18) + lVar6 * 8) + 1;
    }
    mkl_set_interface_layer(0x278b80);
    P_00[0x14].x = (c_float *)0xfffffffffffffffe;
    P_00[0x14].nz = 1;
    P_00[0x15].nzmax = 1;
    P_00[0x15].m = 1;
    P_00[0x15].i = (c_int *)0x0;
    P_00[0x15].p = (c_int *)0x0;
    for (pt = (void **)0x0; (long)pt < 0x40; pt = (void **)((long)pt + 1)) {
      (&P_00[0xb].p)[(long)pt] = (c_int *)0x0;
      (&P_00[2].n)[(long)pt] = 0;
    }
    P_00[0xb].p = (c_int *)0x1;
    P_00[0xb].i = (c_int *)0x3;
    if (in_R8 == (c_int *)0x0) {
      P_00[0xc].m = 0;
    }
    else {
      P_00[0xc].m = 1;
    }
    P_00[0xc].p = (c_int *)0x0;
    P_00[0xc].x = (c_float *)0xd;
    P_00[0x10].n = 0;
    pcVar4 = (c_float *)mkl_get_max_threads();
    P_00->x = pcVar4;
    P_00[0x15].n = 0xb;
    n = *(c_int **)(P_00->nz + 0x28);
    ppcVar5 = &P_00[0x15].p;
    pardiso(pt,pcVar2,mnum,&P_00->nzmax,(c_int *)ppcVar5,n,unaff_RBX,unaff_R12,unaff_R13,unaff_R14,
            unaff_R15,unaff_RBP,unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018)
    ;
    if (P_00[0x15].p == (c_int *)0x0) {
      P_00[0x15].n = 0x16;
      s_00 = (pardiso_solver *)&P_00[0x15].p;
      pardiso(pt,pcVar2,mnum,&P_00->nzmax,(c_int *)ppcVar5,n,unaff_RBX,unaff_R12,unaff_R13,unaff_R14
              ,unaff_R15,unaff_RBP,unaff_retaddr,in_stack_00000008,in_stack_00000010,
              in_stack_00000018);
      if (P_00[0x15].p == (c_int *)0x0) {
        local_38 = 0;
      }
      else {
        printf("ERROR in %s: ","init_linsys_solver_pardiso");
        printf("Error during numerical factorization: %d",(ulong)P_00[0x15].p & 0xffffffff);
        printf("\n");
        free_linsys_solver_pardiso(s_00);
        *in_RDI = 0;
        local_38 = 4;
      }
    }
    else {
      printf("ERROR in %s: ","init_linsys_solver_pardiso");
      printf("Error during symbolic factorization: %d",(ulong)P_00[0x15].p & 0xffffffff);
      printf("\n");
      free_linsys_solver_pardiso(in_stack_ffffffffffffff60);
      *in_RDI = 0;
      local_38 = 4;
    }
  }
  return local_38;
}

Assistant:

c_int init_linsys_solver_pardiso(pardiso_solver ** sp, const csc * P, const csc * A, c_float sigma, const c_float * rho_vec, c_int polish){
    c_int i;                     // loop counter
    c_int nnzKKT;                // Number of nonzeros in KKT
    // Define Variables
    c_int n_plus_m;              // n_plus_m dimension


    // Allocate private structure to store KKT factorization
    pardiso_solver *s;
    s = c_calloc(1, sizeof(pardiso_solver));
    *sp = s;

    // Size of KKT
    s->n = P->n;
    s->m = A->m;
    n_plus_m = s->n + s->m;
    s->nKKT = n_plus_m;

    // Sigma parameter
    s->sigma = sigma;

    // Polishing flag
    s->polish = polish;

    // Link Functions
    s->solve = &solve_linsys_pardiso;
    s->free = &free_linsys_solver_pardiso;
    s->update_matrices = &update_linsys_solver_matrices_pardiso;
    s->update_rho_vec = &update_linsys_solver_rho_vec_pardiso;

    // Assign type
    s->type = MKL_PARDISO_SOLVER;

    // Working vector
    s->bp = (c_float *)c_malloc(sizeof(c_float) * n_plus_m);

    // Solution vector
    s->sol  = (c_float *)c_malloc(sizeof(c_float) * n_plus_m);

    // Parameter vector
    s->rho_inv_vec = (c_float *)c_malloc(sizeof(c_float) * n_plus_m);

    // Form KKT matrix
    if (polish){ // Called from polish()
        // Use s->rho_inv_vec for storing param2 = vec(delta)
        for (i = 0; i < A->m; i++){
            s->rho_inv_vec[i] = sigma;
        }

        s->KKT = form_KKT(P, A, 1, sigma, s->rho_inv_vec, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL);
    }
    else { // Called from ADMM algorithm

        // Allocate vectors of indices
        s->PtoKKT = c_malloc((P->p[P->n]) * sizeof(c_int));
        s->AtoKKT = c_malloc((A->p[A->n]) * sizeof(c_int));
        s->rhotoKKT = c_malloc((A->m) * sizeof(c_int));

        // Use s->rho_inv_vec for storing param2 = rho_inv_vec
        for (i = 0; i < A->m; i++){
            s->rho_inv_vec[i] = 1. / rho_vec[i];
        }

        s->KKT = form_KKT(P, A, 1, sigma, s->rho_inv_vec,
                             s->PtoKKT, s->AtoKKT,
                             &(s->Pdiag_idx), &(s->Pdiag_n), s->rhotoKKT);
    }

    // Check if matrix has been created
    if (!(s->KKT)) {
#ifdef PRINTING
	    c_eprint("Error in forming KKT matrix");
#endif
        free_linsys_solver_pardiso(s);
        return OSQP_LINSYS_SOLVER_INIT_ERROR;
    } else {
	    // Adjust indexing for Pardiso
	    nnzKKT = s->KKT->p[s->KKT->m];
	    s->KKT_i = c_malloc((nnzKKT) * sizeof(c_int));
	    s->KKT_p = c_malloc((s->KKT->m + 1) * sizeof(c_int));

	    for(i = 0; i < nnzKKT; i++){
	    	s->KKT_i[i] = s->KKT->i[i] + 1;
	    }
	    for(i = 0; i < n_plus_m+1; i++){
	    	s->KKT_p[i] = s->KKT->p[i] + 1;
	    }

    }

    // Set MKL interface layer (Long integers if activated)
#ifdef DLONG
    mkl_set_interface_layer(MKL_INTERFACE_ILP64);
#else
    mkl_set_interface_layer(MKL_INTERFACE_LP64);
#endif

    // Set Pardiso variables
    s->mtype = -2;        // Real symmetric indefinite matrix
    s->nrhs = 1;          // Number of right hand sides
    s->maxfct = 1;        // Maximum number of numerical factorizations
    s->mnum = 1;          // Which factorization to use
    s->msglvl = 0;        // Do not print statistical information
    s->error = 0;         // Initialize error flag
    for ( i = 0; i < 64; i++ ) {
        s->iparm[i] = 0;  // Setup Pardiso control parameters
        s->pt[i] = 0;     // Initialize the internal solver memory pointer
    }
    s->iparm[0] = 1;      // No solver default
    s->iparm[1] = 3;      // Fill-in reordering from OpenMP
    if (polish) {
        s->iparm[5] = 1;  // Write solution into b
    } else {
        s->iparm[5] = 0;  // Do NOT write solution into b
    }
    /* s->iparm[7] = 2;      // Max number of iterative refinement steps */
    s->iparm[7] = 0;      // Number of iterative refinement steps (auto, performs them only if perturbed pivots are obtained)
    s->iparm[9] = 13;     // Perturb the pivot elements with 1E-13
    s->iparm[34] = 0;     // Use Fortran-style indexing for indices
    /* s->iparm[34] = 1;     // Use C-style indexing for indices */

    // Print number of threads
    s->nthreads = mkl_get_max_threads();

    // Reordering and symbolic factorization
    s->phase = PARDISO_SYMBOLIC;
    pardiso (s->pt, &(s->maxfct), &(s->mnum), &(s->mtype), &(s->phase),
             &(s->nKKT), s->KKT->x, s->KKT_p, s->KKT_i, &(s->idum), &(s->nrhs),
             s->iparm, &(s->msglvl), &(s->fdum), &(s->fdum), &(s->error));
    if ( s->error != 0 ){
#ifdef PRINTING
        c_eprint("Error during symbolic factorization: %d", (int)s->error);
#endif
        free_linsys_solver_pardiso(s);
        *sp = OSQP_NULL;
        return OSQP_LINSYS_SOLVER_INIT_ERROR;
    }

    // Numerical factorization
    s->phase = PARDISO_NUMERIC;
    pardiso (s->pt, &(s->maxfct), &(s->mnum), &(s->mtype), &(s->phase),
             &(s->nKKT), s->KKT->x, s->KKT_p, s->KKT_i, &(s->idum), &(s->nrhs),
             s->iparm, &(s->msglvl), &(s->fdum), &(s->fdum), &(s->error));
    if ( s->error ){
#ifdef PRINTING
        c_eprint("Error during numerical factorization: %d", (int)s->error);
#endif
        free_linsys_solver_pardiso(s);
        *sp = OSQP_NULL;
        return OSQP_LINSYS_SOLVER_INIT_ERROR;
    }


    // No error
    return 0;
}